

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void selectDisplayConnection(timeval *timeout)

{
  int iVar1;
  fd_set *__arr;
  uint __i;
  int fd;
  fd_set fds;
  timeval *timeout_local;
  
  fds.__fds_bits[0xf] = (__fd_mask)timeout;
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    (&__i + (ulong)(uint)__arr * 2)[0] = 0;
    (&__i + (ulong)(uint)__arr * 2)[1] = 0;
  }
  *(ulong *)(&__i + (long)(iVar1 / 0x40) * 2) =
       1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | *(ulong *)(&__i + (long)(iVar1 / 0x40) * 2);
  select(iVar1 + 1,(fd_set *)&__i,(fd_set *)0x0,(fd_set *)0x0,(timeval *)fds.__fds_bits[0xf]);
  return;
}

Assistant:

void selectDisplayConnection(struct timeval* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);

    FD_ZERO(&fds);
    FD_SET(fd, &fds);

    // select(1) is used instead of an X function like XNextEvent, as the
    // wait inside those are guarded by the mutex protecting the display
    // struct, locking out other threads from using X (including GLX)
    select(fd + 1, &fds, NULL, NULL, timeout);
}